

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

int xmlBufGetAllocationScheme(xmlBufPtr buf)

{
  if (buf != (xmlBufPtr)0x0) {
    return buf->alloc;
  }
  return -1;
}

Assistant:

int
xmlBufGetAllocationScheme(xmlBufPtr buf) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufGetAllocationScheme: buf == NULL\n");
#endif
        return(-1);
    }
    return(buf->alloc);
}